

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O3

void msgpack11::anon_unknown_0::dump_data<unsigned_int>(uint value,string *out)

{
  long lVar1;
  EndianConverter<unsigned_int> converter;
  
  if ((anonymous_namespace)::is_big_endian == '\x01') {
    lVar1 = 0;
    do {
      std::__cxx11::string::push_back((char)out);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
  }
  else {
    lVar1 = 4;
    do {
      std::__cxx11::string::push_back((char)out);
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void dump_data(T value, std::string &out)
{
    EndianConverter<T> converter;
    converter.value.packed = value;

    auto f = [&](uint8_t byte) {
        out.push_back(byte);
    };

    if(is_big_endian)
    {
        std::for_each(converter.value.bytes.begin(), converter.value.bytes.end(), f);
    }
    else
    {
        std::for_each(converter.value.bytes.rbegin(), converter.value.bytes.rend(), f);
    }
}